

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  int32_t lenarray;
  rle16_t *prVar1;
  uint uVar2;
  undefined8 in_RAX;
  run_container_t *run;
  array_container_t *paVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  int card;
  int iVar7;
  undefined4 uStack_38;
  uint8_t typecode_local;
  undefined4 local_34;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_38 = CONCAT13(typecode,(int3)in_RAX);
  run = (run_container_t *)get_writable_copy_if_shared(c,&typecode_local);
  if (typecode_local != '\x03') {
    if (typecode_local == '\x02') {
      *new_typecode = '\x02';
      prVar1 = run->runs;
      lenarray = run->n_runs;
      uVar2 = binarySearch(&prVar1->value,lenarray,val);
      if ((int)uVar2 < 0) {
        return run;
      }
      memmove(&prVar1->value + uVar2,&prVar1->length + uVar2,(long)(int)(lenarray + ~uVar2) * 2);
      run->n_runs = run->n_runs + -1;
      return run;
    }
    if (typecode_local == '\x01') {
      uVar4 = *(ulong *)(run->runs + (ulong)(val >> 6) * 2);
      iVar7 = run->n_runs - (uint)((uVar4 >> ((ulong)val & 0x3f) & 1) != 0);
      run->n_runs = iVar7;
      *(ulong *)(run->runs + (ulong)(val >> 6) * 2) = uVar4 & ~(1L << ((ulong)val & 0x3f));
      if ((iVar7 < 0x1001 & (byte)(uVar4 >> ((byte)val & 0x3f))) != 1) {
        *new_typecode = '\x01';
        return run;
      }
      *new_typecode = '\x02';
      paVar3 = array_container_from_bitset((bitset_container_t *)run);
      return paVar3;
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1236,
                  "container_t *container_remove(container_t *, uint16_t, uint8_t, uint8_t *)");
  }
  prVar1 = run->runs;
  uVar2 = interleavedBinarySearch(prVar1,run->n_runs,val);
  if ((int)uVar2 < 0) {
    if (uVar2 == 0xffffffff) goto LAB_0010fceb;
    uVar4 = (ulong)(-uVar2 - 2);
    uVar6 = (uint)val - (uint)prVar1[uVar4].value;
    uVar5 = prVar1[uVar4].length;
    if ((int)uVar6 < (int)(uint)uVar5) {
      _uStack_38 = (ulong)CONCAT24(uVar5,uStack_38);
      prVar1[uVar4].length = (ushort)uVar6 - 1;
      uVar2 = ~uVar2;
      makeRoomAtIndex(run,(uint16_t)uVar2);
      prVar1 = run->runs;
      prVar1[uVar2].value = val + 1;
      prVar1[uVar2].length = (short)(_uStack_38 >> 0x20) + ~(ushort)uVar6;
      goto LAB_0010fceb;
    }
    if (uVar6 != uVar5) goto LAB_0010fceb;
  }
  else {
    uVar4 = (ulong)uVar2;
    uVar5 = prVar1[uVar4].length;
    if (uVar5 == 0) {
      recoverRoomAtIndex(run,(uint16_t)uVar2);
      goto LAB_0010fceb;
    }
    prVar1[uVar4].value = prVar1[uVar4].value + 1;
  }
  prVar1[uVar4].length = uVar5 - 1;
LAB_0010fceb:
  *new_typecode = '\x03';
  return run;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode
){
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}